

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

void __thiscall kratos::LatchVisitor::visit(LatchVisitor *this,Generator *generator)

{
  long lVar1;
  long lVar2;
  undefined1 local_60 [8];
  shared_ptr<kratos::Stmt> stmt;
  shared_ptr<kratos::StmtBlock> blk;
  shared_ptr<kratos::CombinationalStmtBlock> stmt_;
  
  lVar1 = (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(generator->stmts_).
                super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar1 != 0) {
    lVar1 = lVar1 >> 4;
    lVar2 = 0;
    do {
      Generator::get_stmt((Generator *)local_60,(uint32_t)generator);
      if (*(int *)((long)local_60 + 0x78) == 4) {
        Stmt::as<kratos::StmtBlock>
                  ((Stmt *)&stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
        if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[0xd]
            ._M_use_count == 1) {
          Stmt::as<kratos::SequentialStmtBlock>
                    ((Stmt *)&blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          check_sequential((SequentialStmtBlock *)
                           blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
LAB_001fa58c:
          if (stmt_.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       stmt_.
                       super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
        }
        else if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 [0xd]._M_use_count == 0) {
          Stmt::as<kratos::CombinationalStmtBlock>
                    ((Stmt *)&blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
          check_combinational((CombinationalStmtBlock *)
                              blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi);
          goto LAB_001fa58c;
        }
        if (blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     blk.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
      }
      if (stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      lVar2 = lVar2 + 1;
    } while (lVar1 + (ulong)(lVar1 == 0) != lVar2);
  }
  return;
}

Assistant:

void visit(Generator* generator) override {
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto blk = stmt->as<StmtBlock>();
                if (blk->block_type() == StatementBlockType::Combinational) {
                    // multiple passes to extract assigned variables
                    auto stmt_ = blk->as<CombinationalStmtBlock>();
                    check_combinational(stmt_.get());
                } else if (blk->block_type() == StatementBlockType::Sequential) {
                    // multiple passes to extract assigned variables
                    auto stmt_ = blk->as<SequentialStmtBlock>();
                    check_sequential(stmt_.get());
                }
            }
        }
    }